

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinproc.c
# Opt level: O0

int nn_cinproc_create(nn_ep *ep)

{
  nn_ep *ctx;
  nn_ep *in_RDI;
  nn_fsm *unaff_retaddr;
  nn_cinproc *self;
  nn_ins_fn in_stack_00000018;
  nn_ins_item *in_stack_00000020;
  nn_ep *in_stack_ffffffffffffffe8;
  nn_ep *self_00;
  
  ctx = (nn_ep *)nn_alloc_(0x302a93);
  if (ctx == (nn_ep *)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/inproc/cinproc.c"
            ,0x41);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_ep_tran_setup(in_RDI,&nn_cinproc_ops,ctx);
  nn_ins_item_init((nn_ins_item *)ctx,in_stack_ffffffffffffffe8);
  self_00 = ctx;
  nn_ep_getctx((nn_ep *)0x302b2b);
  nn_fsm_init_root(unaff_retaddr,(nn_fsm_fn)in_RDI,(nn_fsm_fn)self_00,(nn_ctx *)ctx);
  self_00->state = 1;
  nn_list_init((nn_list *)&(self_00->item).prev);
  nn_ep_stat_increment(self_00,(int)((ulong)ctx >> 0x20),(int)ctx);
  nn_fsm_start((nn_fsm *)0x302b80);
  nn_ins_connect(in_stack_00000020,in_stack_00000018);
  return 0;
}

Assistant:

int nn_cinproc_create (struct nn_ep *ep)
{
    struct nn_cinproc *self;

    self = nn_alloc (sizeof (struct nn_cinproc), "cinproc");
    alloc_assert (self);

    nn_ep_tran_setup (ep, &nn_cinproc_ops, self);

    nn_ins_item_init (&self->item, ep);
    nn_fsm_init_root (&self->fsm, nn_cinproc_handler, nn_cinproc_shutdown,
        nn_ep_getctx (ep));
    self->state = NN_CINPROC_STATE_IDLE;
    nn_list_init (&self->sinprocs);

    nn_ep_stat_increment (ep, NN_STAT_INPROGRESS_CONNECTIONS, 1);

    /*  Start the state machine. */
    nn_fsm_start (&self->fsm);

    /*  Register the inproc endpoint into a global repository. */
    nn_ins_connect (&self->item, nn_cinproc_connect);

    return 0;
}